

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

char * sinc_get_description(int src_enum)

{
  char *pcStack_10;
  int src_enum_local;
  
  if (src_enum == 0) {
    pcStack_10 = "Band limited sinc interpolation, best quality, 144dB SNR, 96% BW.";
  }
  else if (src_enum == 1) {
    pcStack_10 = "Band limited sinc interpolation, medium quality, 121dB SNR, 90% BW.";
  }
  else if (src_enum == 2) {
    pcStack_10 = "Band limited sinc interpolation, fastest, 97dB SNR, 80% BW.";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE const char*
sinc_get_description (int src_enum)
{
	switch (src_enum)
	{	case SRC_SINC_FASTEST :
			return "Band limited sinc interpolation, fastest, 97dB SNR, 80% BW." ;

		case SRC_SINC_MEDIUM_QUALITY :
			return "Band limited sinc interpolation, medium quality, 121dB SNR, 90% BW." ;

		case SRC_SINC_BEST_QUALITY :
			return "Band limited sinc interpolation, best quality, 144dB SNR, 96% BW." ;

		default :
			break ;
		} ;

	return NULL ;
}